

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderManager.cpp
# Opt level: O0

Mesh * __thiscall
Rml::RenderManager::ReleaseResource
          (Mesh *__return_storage_ptr__,RenderManager *this,Geometry *geometry)

{
  StableVectorIndex SVar1;
  code *pcVar2;
  GeometryData *__obj;
  bool bVar3;
  StableVectorIndex SVar4;
  GeometryData local_b0;
  Mesh local_68;
  undefined1 local_29;
  GeometryData *local_28;
  GeometryData *data;
  Geometry *geometry_local;
  RenderManager *this_local;
  Mesh *result;
  
  data = (GeometryData *)geometry;
  geometry_local = (Geometry *)this;
  this_local = (RenderManager *)__return_storage_ptr__;
  if ((((geometry->
        super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ).render_manager != this) ||
      (SVar1 = (geometry->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).resource_handle,
      SVar4 = UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
              ::InvalidHandle(), SVar1 == SVar4)) &&
     (bVar3 = Assert("RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle())"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/RenderManager.cpp"
                     ,0x16c), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_28 = StableVector<Rml::RenderManager::GeometryData>::operator[]
                       (&this->geometry_list,
                        *(StableVectorIndex *)
                         &(data->mesh).vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  if (local_28->handle != 0) {
    (*this->render_interface->_vptr_RenderInterface[4])(this->render_interface,local_28->handle);
    local_28->handle = 0;
  }
  __obj = local_28;
  local_29 = 0;
  local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Mesh::Mesh(&local_68);
  ::std::exchange<Rml::Mesh,Rml::Mesh>(__return_storage_ptr__,&__obj->mesh,&local_68);
  Mesh::~Mesh(&local_68);
  StableVector<Rml::RenderManager::GeometryData>::erase
            (&local_b0,&this->geometry_list,
             *(StableVectorIndex *)
              &(data->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  GeometryData::~GeometryData(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

Mesh RenderManager::ReleaseResource(const Geometry& geometry)
{
	RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle());

	GeometryData& data = geometry_list[geometry.resource_handle];
	if (data.handle)
	{
		render_interface->ReleaseGeometry(data.handle);
		data.handle = {};
	}
	Mesh result = std::exchange(data.mesh, Mesh());
	geometry_list.erase(geometry.resource_handle);
	return result;
}